

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDSat(Abc_Ntk_t *pNtk,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,int nLearnedStart,
               int nLearnedDelta,int nLearnedPerce,int fAlignPol,int fAndOuts,int fNewSolver,
               int fVerbose)

{
  int iVar1;
  Aig_Man_t *pMan;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x716,
                  "int Abc_NtkDSat(Abc_Ntk_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
                 );
  }
  if (pNtk->nObjCounts[8] == 0) {
    pMan = Abc_NtkToDar(pNtk,0,0);
    iVar1 = Fra_FraigSat(pMan,nConfLimit,nInsLimit,nLearnedStart,nLearnedDelta,nLearnedPerce,
                         fAlignPol,fAndOuts,fNewSolver,fVerbose);
    pNtk->pModel = (int *)pMan->pData;
    pMan->pData = (void *)0x0;
    Aig_ManStop(pMan);
    return iVar1;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                ,0x717,
                "int Abc_NtkDSat(Abc_Ntk_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
               );
}

Assistant:

int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose )
{
    Aig_Man_t * pMan;
    int RetValue;//, clk = Abc_Clock();
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
//    assert( Abc_NtkPoNum(pNtk) == 1 );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    RetValue = Fra_FraigSat( pMan, nConfLimit, nInsLimit, nLearnedStart, nLearnedDelta, nLearnedPerce, fAlignPol, fAndOuts, fNewSolver, fVerbose ); 
    pNtk->pModel = (int *)pMan->pData, pMan->pData = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}